

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O2

void __thiscall
QHttp2ProtocolHandler::finishStreamWithError
          (QHttp2ProtocolHandler *this,QHttp2Stream *stream,NetworkError error,QString *message)

{
  QLoggingCategory *pQVar1;
  QDebug *pQVar2;
  long in_FS_OFFSET;
  QDebug local_58;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> local_50;
  QHttp2Stream *stream_local;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  stream_local = stream;
  QHttp2Stream::sendRST_STREAM((QHttp2Stream *)stream,CANCEL);
  QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::value
            (&local_50,
             (QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
             (this + 0x50),&stream_local);
  if (local_50.second != (QHttpNetworkReply *)0x0) {
    QObject::disconnect(&(local_50.second)->super_QObject,(QObject *)this,(char *)0x0);
    QHttpNetworkReply::finishedWithError((QHttpNetworkReply *)local_50.second,error,message);
  }
  pQVar1 = QtPrivateLogging::QT_HTTP2();
  if (((pQVar1->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
    QMessageLogger::warning();
    pQVar2 = QDebug::operator<<(&local_58,"stream");
    pQVar2 = QDebug::operator<<(pQVar2,stream_local->m_streamID);
    pQVar2 = QDebug::operator<<(pQVar2,"finished with error:");
    QDebug::operator<<(pQVar2,message);
    QDebug::~QDebug(&local_58);
  }
  QHttpNetworkRequest::~QHttpNetworkRequest(&local_50.first);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2ProtocolHandler::finishStreamWithError(QHttp2Stream *stream,
        QNetworkReply::NetworkError error, const QString &message)
{
    stream->sendRST_STREAM(CANCEL);
    const HttpMessagePair &pair = requestReplyPairs.value(stream);
    if (auto *httpReply = pair.second) {
        httpReply->disconnect(this);

        // TODO: error message must be translated!!! (tr)
        emit httpReply->finishedWithError(error, message);
    }

    qCWarning(QT_HTTP2) << "stream" << stream->streamID() << "finished with error:" << message;
}